

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

void ipc_pipe_recv_start(ipc_pipe *p)

{
  int iVar1;
  nni_aio *aio_00;
  nni_aio *aio;
  nni_iov iov;
  ipc_pipe *p_local;
  
  iov.iov_len = (size_t)p;
  if (p->rx_msg != (nni_msg *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc.c"
              ,0x211,"p->rx_msg == NULL");
  }
  if ((*(byte *)(iov.iov_len + 0x18) & 1) == 0) {
    iVar1 = nni_list_empty((nni_list *)(iov.iov_len + 0x78));
    if (iVar1 == 0) {
      aio = (nni_aio *)(iov.iov_len + 0x49);
      iov.iov_buf = (void *)0x9;
      nni_aio_set_iov((nni_aio *)(iov.iov_len + 0x270),1,(nni_iov *)&aio);
      nng_stream_recv(*(nng_stream **)iov.iov_len,(nng_aio *)(iov.iov_len + 0x270));
    }
  }
  else {
    while (aio_00 = (nni_aio *)nni_list_first((nni_list *)(iov.iov_len + 0x78)),
          aio_00 != (nni_aio *)0x0) {
      nni_list_remove((nni_list *)(iov.iov_len + 0x78),aio_00);
      nni_aio_finish_error(aio_00,NNG_ECLOSED);
    }
  }
  return;
}

Assistant:

static void
ipc_pipe_recv_start(ipc_pipe *p)
{
	nni_iov iov;
	NNI_ASSERT(p->rx_msg == NULL);

	if (p->closed) {
		nni_aio *aio;
		while ((aio = nni_list_first(&p->recv_q)) != NULL) {
			nni_list_remove(&p->recv_q, aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
		return;
	}
	if (nni_list_empty(&p->recv_q)) {
		return;
	}

	// Schedule a read of the IPC header.
	iov.iov_buf = p->rx_head;
	iov.iov_len = sizeof(p->rx_head);
	nni_aio_set_iov(&p->rx_aio, 1, &iov);

	nng_stream_recv(p->conn, &p->rx_aio);
}